

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

void xmlInitCharEncodingHandlers(void)

{
  if (handlers != (xmlCharEncodingHandlerPtr *)0x0) {
    return;
  }
  handlers = (xmlCharEncodingHandlerPtr *)(*xmlMalloc)(400);
  if (handlers != (xmlCharEncodingHandlerPtr *)0x0) {
    xmlNewCharEncodingHandler("UTF-8",UTF8ToUTF8,UTF8ToUTF8);
    xmlUTF16LEHandler = xmlNewCharEncodingHandler("UTF-16LE",UTF16LEToUTF8,UTF8ToUTF16LE);
    xmlUTF16BEHandler = xmlNewCharEncodingHandler("UTF-16BE",UTF16BEToUTF8,UTF8ToUTF16BE);
    xmlNewCharEncodingHandler("UTF-16",UTF16LEToUTF8,UTF8ToUTF16);
    xmlNewCharEncodingHandler("ISO-8859-1",isolat1ToUTF8,UTF8Toisolat1);
    xmlNewCharEncodingHandler("ASCII",asciiToUTF8,UTF8Toascii);
    xmlNewCharEncodingHandler("US-ASCII",asciiToUTF8,UTF8Toascii);
    xmlNewCharEncodingHandler("HTML",(xmlCharEncodingInputFunc)0x0,UTF8ToHtml);
    return;
  }
  __xmlSimpleError(0x1b,2,(xmlNodePtr)0x0,(char *)0x0,
                   "xmlInitCharEncodingHandlers : out of memory !\n");
  return;
}

Assistant:

void
xmlInitCharEncodingHandlers(void) {
    unsigned short int tst = 0x1234;
    unsigned char *ptr = (unsigned char *) &tst;

    if (handlers != NULL) return;

    handlers = (xmlCharEncodingHandlerPtr *)
        xmlMalloc(MAX_ENCODING_HANDLERS * sizeof(xmlCharEncodingHandlerPtr));

    if (*ptr == 0x12) xmlLittleEndian = 0;
    else if (*ptr == 0x34) xmlLittleEndian = 1;
    else {
        xmlEncodingErr(XML_ERR_INTERNAL_ERROR,
	               "Odd problem at endianness detection\n", NULL);
    }

    if (handlers == NULL) {
        xmlEncodingErrMemory("xmlInitCharEncodingHandlers : out of memory !\n");
	return;
    }
    xmlNewCharEncodingHandler("UTF-8", UTF8ToUTF8, UTF8ToUTF8);
#ifdef LIBXML_OUTPUT_ENABLED
    xmlUTF16LEHandler =
          xmlNewCharEncodingHandler("UTF-16LE", UTF16LEToUTF8, UTF8ToUTF16LE);
    xmlUTF16BEHandler =
          xmlNewCharEncodingHandler("UTF-16BE", UTF16BEToUTF8, UTF8ToUTF16BE);
    xmlNewCharEncodingHandler("UTF-16", UTF16LEToUTF8, UTF8ToUTF16);
    xmlNewCharEncodingHandler("ISO-8859-1", isolat1ToUTF8, UTF8Toisolat1);
    xmlNewCharEncodingHandler("ASCII", asciiToUTF8, UTF8Toascii);
    xmlNewCharEncodingHandler("US-ASCII", asciiToUTF8, UTF8Toascii);
#ifdef LIBXML_HTML_ENABLED
    xmlNewCharEncodingHandler("HTML", NULL, UTF8ToHtml);
#endif
#else
    xmlUTF16LEHandler =
          xmlNewCharEncodingHandler("UTF-16LE", UTF16LEToUTF8, NULL);
    xmlUTF16BEHandler =
          xmlNewCharEncodingHandler("UTF-16BE", UTF16BEToUTF8, NULL);
    xmlNewCharEncodingHandler("UTF-16", UTF16LEToUTF8, NULL);
    xmlNewCharEncodingHandler("ISO-8859-1", isolat1ToUTF8, NULL);
    xmlNewCharEncodingHandler("ASCII", asciiToUTF8, NULL);
    xmlNewCharEncodingHandler("US-ASCII", asciiToUTF8, NULL);
#endif /* LIBXML_OUTPUT_ENABLED */
#if !defined(LIBXML_ICONV_ENABLED) && !defined(LIBXML_ICU_ENABLED)
#ifdef LIBXML_ISO8859X_ENABLED
    xmlRegisterCharEncodingHandlersISO8859x ();
#endif
#endif

}